

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool wasm::Match::Internal::
     Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
     ::match(matched_t<wasm::Select_*> candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            *matchers)

{
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *this;
  bool bVar1;
  Expression *candidate_00;
  bool local_1a;
  GetComponent<wasm::Select_*,_0> local_19;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *local_18;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *matchers_local;
  matched_t<wasm::Select_*> candidate_local;
  
  this = matchers->curr;
  local_18 = matchers;
  matchers_local =
       (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
        *)candidate;
  candidate_00 = GetComponent<wasm::Select_*,_0>::operator()(&local_19,candidate);
  bVar1 = Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>::matches(this,candidate_00);
  local_1a = false;
  if (bVar1) {
    local_1a = Components<wasm::Select_*,_1,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
               ::match((matched_t<wasm::Select_*>)matchers_local,&local_18->next);
  }
  return local_1a;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }